

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearDriveline::ArchiveIN
          (ChLinkMotorLinearDriveline *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  ChNameValue<std::shared_ptr<chrono::ChShaft>_> local_48;
  shared_ptr<chrono::ChShaft> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMotorLinearDriveline>(marchive);
  ChLinkMotorLinear::ArchiveIN(&this->super_ChLinkMotorLinear,marchive);
  local_48._value = (shared_ptr<chrono::ChShaft> *)&(this->super_ChLinkMotorLinear).field_0x278;
  local_48._name = "innershaft1lin";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::ChShaft>(marchive,&local_48);
  local_48._value = &this->innershaft2lin;
  local_48._name = "innershaft2lin";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::ChShaft>(marchive,&local_48);
  local_48._value = &this->innershaft2rot;
  local_48._name = "innershaft2rot";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::ChShaft>(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::ChShaft> *)&this->innerconstraint1lin;
  local_48._name = "innerconstraint1lin";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::ChShaftsBodyTranslation>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChShaftsBodyTranslation>_> *)&local_48);
  local_48._value = (shared_ptr<chrono::ChShaft> *)&this->innerconstraint2lin;
  local_48._name = "innerconstraint2lin";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::ChShaftsBodyTranslation>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChShaftsBodyTranslation>_> *)&local_48);
  local_48._value = (shared_ptr<chrono::ChShaft> *)&this->innerconstraint2rot;
  local_48._name = "innerconstraint2rot";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::ChShaftsBody>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChShaftsBody>_> *)&local_48);
  local_30.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->shaft2_rotation_dir;
  local_48._value = &local_30;
  local_48._name = "shaft2_rotation_dir";
  local_48._flags = '\0';
  local_30.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__ChFunctorArchiveIn_00b03258;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_48);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMotorLinearDriveline>();

    // deserialize parent class
    ChLinkMotorLinear::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(innershaft1lin);
    marchive >> CHNVP(innershaft2lin);
    marchive >> CHNVP(innershaft2rot);
    marchive >> CHNVP(innerconstraint1lin);
    marchive >> CHNVP(innerconstraint2lin);
    marchive >> CHNVP(innerconstraint2rot);
    marchive >> CHNVP(shaft2_rotation_dir);
}